

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

Shape * __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::MakeLoop(wasm::InsertOrderedSet<CFG::Block*>&,wasm
::InsertOrderedSet<CFG::Block*>&,wasm::InsertOrderedSet<CFG::Block_>__
          (void *this,BlockSet *Blocks,BlockSet *Entries,BlockSet *NextEntries)

{
  size_t *this_00;
  Block *pBVar1;
  bool bVar2;
  size_t sVar3;
  reference ppBVar4;
  iterator position;
  BlockSet *this_01;
  reference __in;
  type *contained;
  LoopShape *Ancestor;
  Shape *pSVar5;
  Shape *Inner;
  Block *Next;
  iterator __end2_2;
  iterator __begin2_2;
  BlockSet *__range2_2;
  Block *Entry;
  iterator __end2_1;
  iterator __begin2_1;
  BlockSet *__range2_1;
  LoopShape *Loop;
  type *_;
  type *Possible;
  _Self local_148;
  iterator __end3;
  iterator __begin3;
  BlockBranchMap *__range3;
  Block *Curr_1;
  iterator __end2;
  iterator __begin2;
  BlockSet *__range2;
  Block *Prev;
  iterator __end4;
  iterator __begin4;
  BlockSet *__range4;
  _List_iterator<CFG::Block_*> local_e8;
  Block *local_e0;
  Block *Curr;
  undefined1 local_c8 [8];
  BlockSet Queue;
  BlockSet InnerBlocks;
  BlockSet *NextEntries_local;
  BlockSet *Entries_local;
  BlockSet *Blocks_local;
  Analyzer *this_local;
  
  ::wasm::InsertOrderedSet<CFG::Block_*>::InsertOrderedSet
            ((InsertOrderedSet<CFG::Block_*> *)
             &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
              _M_node._M_size);
  ::wasm::InsertOrderedSet<CFG::Block_*>::InsertOrderedSet
            ((InsertOrderedSet<CFG::Block_*> *)local_c8,Entries);
  while (sVar3 = ::wasm::InsertOrderedSet<CFG::Block_*>::size
                           ((InsertOrderedSet<CFG::Block_*> *)local_c8), sVar3 != 0) {
    local_e8._M_node =
         (_List_node_base *)
         ::wasm::InsertOrderedSet<CFG::Block_*>::begin((InsertOrderedSet<CFG::Block_*> *)local_c8);
    ppBVar4 = std::_List_iterator<CFG::Block_*>::operator*(&local_e8);
    local_e0 = *ppBVar4;
    position = ::wasm::InsertOrderedSet<CFG::Block_*>::begin
                         ((InsertOrderedSet<CFG::Block_*> *)local_c8);
    ::wasm::InsertOrderedSet<CFG::Block_*>::erase
              ((InsertOrderedSet<CFG::Block_*> *)local_c8,position);
    bVar2 = contains<wasm::InsertOrderedSet<CFG::Block*>,CFG::Block*>
                      ((InsertOrderedSet<CFG::Block_*> *)
                       &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                        _M_impl._M_node._M_size,&local_e0);
    if (!bVar2) {
      ::wasm::InsertOrderedSet<CFG::Block_*>::insert
                ((InsertOrderedSet<CFG::Block_*> *)
                 &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
                  _M_node._M_size,&local_e0);
      ::wasm::InsertOrderedSet<CFG::Block_*>::erase(Blocks,&local_e0);
      this_01 = &local_e0->BranchesIn;
      __end4 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin(this_01);
      Prev = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end(this_01);
      while (bVar2 = std::operator!=(&__end4,(_Self *)&Prev), bVar2) {
        ppBVar4 = std::_List_iterator<CFG::Block_*>::operator*(&__end4);
        __range2 = (BlockSet *)*ppBVar4;
        ::wasm::InsertOrderedSet<CFG::Block_*>::insert
                  ((InsertOrderedSet<CFG::Block_*> *)local_c8,(Block **)&__range2);
        std::_List_iterator<CFG::Block_*>::operator++(&__end4);
      }
    }
  }
  sVar3 = ::wasm::InsertOrderedSet<CFG::Block_*>::size
                    ((InsertOrderedSet<CFG::Block_*> *)
                     &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                      _M_impl._M_node._M_size);
  if (sVar3 == 0) {
    __assert_fail("InnerBlocks.size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                  ,0x48a,
                  "Shape *CFG::Relooper::Calculate(Block *)::Analyzer::MakeLoop(BlockSet &, BlockSet &, BlockSet &)"
                 );
  }
  this_00 = &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
             _M_node._M_size;
  __end2 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin((InsertOrderedSet<CFG::Block_*> *)this_00);
  Curr_1 = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end
                              ((InsertOrderedSet<CFG::Block_*> *)this_00);
  while (bVar2 = std::operator!=(&__end2,(_Self *)&Curr_1), bVar2) {
    ppBVar4 = std::_List_iterator<CFG::Block_*>::operator*(&__end2);
    pBVar1 = *ppBVar4;
    __end3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin(&pBVar1->BranchesOut);
    local_148._M_node =
         (_List_node_base *)
         ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end(&pBVar1->BranchesOut);
    while (bVar2 = std::operator!=(&__end3,&local_148), bVar2) {
      __in = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator*(&__end3);
      contained = std::get<0ul,CFG::Block*const,CFG::Branch*>(__in);
      std::get<1ul,CFG::Block*const,CFG::Branch*>(__in);
      bVar2 = contains<wasm::InsertOrderedSet<CFG::Block*>,CFG::Block*>
                        ((InsertOrderedSet<CFG::Block_*> *)
                         &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                          _M_impl._M_node._M_size,contained);
      if (!bVar2) {
        ::wasm::InsertOrderedSet<CFG::Block_*>::insert(NextEntries,contained);
      }
      std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&__end3);
    }
    std::_List_iterator<CFG::Block_*>::operator++(&__end2);
  }
  Ancestor = AddLoopShape(*this);
  __end2_1 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin(Entries);
  Entry = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end(Entries);
  while (bVar2 = std::operator!=(&__end2_1,(_Self *)&Entry), bVar2) {
    ppBVar4 = std::_List_iterator<CFG::Block_*>::operator*(&__end2_1);
    Solipsize(CFG::Block*,CFG::Branch::FlowType,CFG::Shape*,wasm::InsertOrderedSet<CFG::Block_>__
              (this,*ppBVar4,Continue,&Ancestor->super_Shape,
               (BlockSet *)
               &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
                _M_node._M_size);
    std::_List_iterator<CFG::Block_*>::operator++(&__end2_1);
  }
  __end2_2 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin(NextEntries);
  Next = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end(NextEntries);
  while (bVar2 = std::operator!=(&__end2_2,(_Self *)&Next), bVar2) {
    ppBVar4 = std::_List_iterator<CFG::Block_*>::operator*(&__end2_2);
    Solipsize(CFG::Block*,CFG::Branch::FlowType,CFG::Shape*,wasm::InsertOrderedSet<CFG::Block_>__
              (this,*ppBVar4,Break,&Ancestor->super_Shape,
               (BlockSet *)
               &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
                _M_node._M_size);
    std::_List_iterator<CFG::Block_*>::operator++(&__end2_2);
  }
  pSVar5 = Process(wasm::InsertOrderedSet<CFG::Block*>&,wasm::InsertOrderedSet<CFG::Block_>__
                     (this,(BlockSet *)
                           &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>
                            ._M_impl._M_node._M_size,Entries);
  Ancestor->Inner = pSVar5;
  ::wasm::InsertOrderedSet<CFG::Block_*>::operator=(&Ancestor->Entries,Entries);
  ::wasm::InsertOrderedSet<CFG::Block_*>::~InsertOrderedSet
            ((InsertOrderedSet<CFG::Block_*> *)local_c8);
  ::wasm::InsertOrderedSet<CFG::Block_*>::~InsertOrderedSet
            ((InsertOrderedSet<CFG::Block_*> *)
             &Queue.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
              _M_node._M_size);
  return &Ancestor->super_Shape;
}

Assistant:

Shape*
    MakeLoop(BlockSet& Blocks, BlockSet& Entries, BlockSet& NextEntries) {
      // Find the inner blocks in this loop. Proceed backwards from the entries
      // until you reach a seen block, collecting as you go.
      BlockSet InnerBlocks;
      BlockSet Queue = Entries;
      while (Queue.size() > 0) {
        Block* Curr = *(Queue.begin());
        Queue.erase(Queue.begin());
        if (!contains(InnerBlocks, Curr)) {
          // This element is new, mark it as inner and remove from outer
          InnerBlocks.insert(Curr);
          Blocks.erase(Curr);
          // Add the elements prior to it
          for (auto* Prev : Curr->BranchesIn) {
            Queue.insert(Prev);
          }
#if 0
          // Add elements it leads to, if they are dead ends. There is no reason not to hoist dead ends
          // into loops, as it can avoid multiple entries after the loop
          for (auto iter = Curr->BranchesOut.begin(); iter != Curr->BranchesOut.end(); iter++) {
            Block* Target = iter->first;
            if (Target->BranchesIn.size() <= 1 && Target->BranchesOut.size() == 0) {
              Queue.insert(Target);
            }
          }
#endif
        }
      }
      assert(InnerBlocks.size() > 0);

      for (auto* Curr : InnerBlocks) {
        for (auto& [Possible, _] : Curr->BranchesOut) {
          if (!contains(InnerBlocks, Possible)) {
            NextEntries.insert(Possible);
          }
        }
      }

#if 0
      // We can avoid multiple next entries by hoisting them into the loop.
      if (NextEntries.size() > 1) {
        BlockBlockSetMap IndependentGroups;
        FindIndependentGroups(NextEntries, IndependentGroups, &InnerBlocks);

        while (IndependentGroups.size() > 0 && NextEntries.size() > 1) {
          Block* Min = nullptr;
          int MinSize = 0;
          for (auto iter = IndependentGroups.begin(); iter != IndependentGroups.end(); iter++) {
            Block* Entry = iter->first;
            BlockSet &Blocks = iter->second;
            if (!Min || Blocks.size() < MinSize) { // TODO: code size, not # of blocks
              Min = Entry;
              MinSize = Blocks.size();
            }
          }
          // check how many new entries this would cause
          BlockSet &Hoisted = IndependentGroups[Min];
          bool abort = false;
          for (auto iter = Hoisted.begin(); iter != Hoisted.end() && !abort; iter++) {
            Block* Curr = *iter;
            for (auto iter = Curr->BranchesOut.begin(); iter != Curr->BranchesOut.end(); iter++) {
              Block* Target = iter->first;
              if (!contains(Hoisted, Target) && !contains(NextEntries, Target)) {
                // abort this hoisting
                abort = true;
                break;
              }
            }
          }
          if (abort) {
            IndependentGroups.erase(Min);
            continue;
          }
          // hoist this entry
          PrintDebug("hoisting %d into loop\n", Min->Id);
          NextEntries.erase(Min);
          for (auto iter = Hoisted.begin(); iter != Hoisted.end(); iter++) {
            Block* Curr = *iter;
            InnerBlocks.insert(Curr);
            Blocks.erase(Curr);
          }
          IndependentGroups.erase(Min);
        }
      }
#endif

      PrintDebug("creating loop block:\n", 0);
      DebugDump(InnerBlocks, "  inner blocks:");
      DebugDump(Entries, "  inner entries:");
      DebugDump(Blocks, "  outer blocks:");
      DebugDump(NextEntries, "  outer entries:");

      LoopShape* Loop = Parent->AddLoopShape();

      // Solipsize the loop, replacing with break/continue and marking branches
      // as Processed (will not affect later calculations) A. Branches to the
      // loop entries become a continue to this shape
      for (auto* Entry : Entries) {
        Solipsize(Entry, Branch::Continue, Loop, InnerBlocks);
      }
      // B. Branches to outside the loop (a next entry) become breaks on this
      // shape
      for (auto* Next : NextEntries) {
        Solipsize(Next, Branch::Break, Loop, InnerBlocks);
      }
      // Finish up
      Shape* Inner = Process(InnerBlocks, Entries);
      Loop->Inner = Inner;
      Loop->Entries = Entries;
      return Loop;
    }